

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeTriang>::ComputeShape
          (TPZCompElH1<pzshape::TPZShapeTriang> *this,TPZVec<double> *intpoint,TPZMaterialData *data
          )

{
  REAL beta;
  REAL alpha;
  int tranpose;
  TPZShapeData *shapedata;
  int in_stack_000000d4;
  double in_stack_000000d8;
  double in_stack_000000e0;
  TPZFMatrix<double> *in_stack_000000e8;
  TPZFMatrix<double> *in_stack_000000f0;
  TPZFMatrix<double> *in_stack_000000f8;
  TPZFMatrix<double> *in_stack_00000100;
  TPZShapeData *in_stack_00001388;
  TPZVec<double> *in_stack_00001390;
  TPZFMatrix<double> *copy;
  TPZFNMatrix<20,_double> *this_00;
  
  TPZShapeH1<pzshape::TPZShapeTriang>::Shape(in_stack_00001390,in_stack_00001388);
  this_00 = (TPZFNMatrix<20,_double> *)0x3ff0000000000000;
  copy = (TPZFMatrix<double> *)0x0;
  TPZFMatrix<double>::MultAdd
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
             in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  TPZFNMatrix<20,_double>::operator=(this_00,copy);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::ComputeShape(TPZVec<REAL> &intpoint, TPZMaterialData &data){
    
    TPZShapeData &shapedata = data;
    TPZShapeH1<TSHAPE>::Shape(intpoint,shapedata);
    int tranpose = 1;
    REAL alpha = 1.;
    REAL beta = 0.;
    data.jacinv.MultAdd(shapedata.fDPhi, data.dphix, data.dphix,alpha,beta,tranpose);
    data.phi = shapedata.fPhi;
}